

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::CheckEntireMessageConsumedAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  uint8 *puVar2;
  int iVar3;
  int iVar4;
  
  bVar1 = this->legitimate_message_end_;
  this->current_limit_ = limit;
  puVar2 = this->buffer_end_;
  this->buffer_end_ = puVar2 + this->buffer_size_after_limit_;
  if (this->total_bytes_limit_ < limit) {
    limit = this->total_bytes_limit_;
  }
  iVar3 = this->total_bytes_read_ - limit;
  iVar4 = 0;
  if (iVar3 != 0 && limit <= this->total_bytes_read_) {
    this->buffer_end_ = puVar2 + this->buffer_size_after_limit_ + -(long)iVar3;
    iVar4 = iVar3;
  }
  this->buffer_size_after_limit_ = iVar4;
  this->legitimate_message_end_ = false;
  return bVar1;
}

Assistant:

inline bool CodedInputStream::ConsumedEntireMessage() {
  return legitimate_message_end_;
}